

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O0

int KINInit(void *kinmem,KINSysFn func,N_Vector tmpl)

{
  int iVar1;
  int nvectorOK;
  int allocOK;
  KINMem kin_mem;
  sunindextype lrw1;
  sunindextype liw1;
  N_Vector tmpl_local;
  KINSysFn func_local;
  void *kinmem_local;
  
  liw1 = (sunindextype)tmpl;
  tmpl_local = (N_Vector)func;
  func_local = (KINSysFn)kinmem;
  if (kinmem == (void *)0x0) {
    KINProcessError((KINMem)0x0,-1,"KINSOL","KINInit","kinsol_mem = NULL illegal.");
    kinmem_local._4_4_ = -1;
  }
  else if (func == (KINSysFn)0x0) {
    KINProcessError((KINMem)kinmem,-2,"KINSOL","KINInit","func = NULL illegal.");
    kinmem_local._4_4_ = -2;
  }
  else {
    iVar1 = KINCheckNvector(tmpl);
    if (iVar1 == 0) {
      KINProcessError((KINMem)kinmem,-2,"KINSOL","KINInit",
                      "A required vector operation is not implemented.");
      kinmem_local._4_4_ = -2;
    }
    else {
      if (*(long *)(*(long *)(liw1 + 8) + 0x20) == 0) {
        *(undefined8 *)((long)kinmem + 0x1b0) = 0;
        *(undefined8 *)((long)kinmem + 0x1b8) = 0;
      }
      else {
        N_VSpace((N_Vector)liw1,(sunindextype *)&kin_mem,&lrw1);
        *(KINMem *)((long)kinmem + 0x1b0) = kin_mem;
        *(sunindextype *)((long)kinmem + 0x1b8) = lrw1;
      }
      iVar1 = KINAllocVectors((KINMem)kinmem,(N_Vector)liw1);
      if (iVar1 == 0) {
        KINProcessError((KINMem)kinmem,-4,"KINSOL","KINInit","A memory request failed.");
        free(kinmem);
        kinmem_local._4_4_ = -4;
      }
      else {
        *(N_Vector *)((long)kinmem + 8) = tmpl_local;
        *(undefined8 *)((long)kinmem + 0x1d0) = 0;
        *(undefined8 *)((long)kinmem + 0x1d8) = 0;
        *(undefined8 *)((long)kinmem + 0x1e0) = 0;
        *(undefined8 *)((long)kinmem + 0x1e8) = 0;
        *(undefined8 *)((long)kinmem + 0x1f8) = 0;
        *(undefined4 *)((long)kinmem + 0x248) = 1;
        kinmem_local._4_4_ = 0;
      }
    }
  }
  return kinmem_local._4_4_;
}

Assistant:

int KINInit(void *kinmem, KINSysFn func, N_Vector tmpl)
{
  sunindextype liw1, lrw1;
  KINMem kin_mem;
  booleantype allocOK, nvectorOK;
  
  /* check kinmem */

  if (kinmem == NULL) {
    KINProcessError(NULL, KIN_MEM_NULL, "KINSOL", "KINInit", MSG_NO_MEM);
    return(KIN_MEM_NULL);
  }
  kin_mem = (KINMem) kinmem;

  if (func == NULL) {
    KINProcessError(kin_mem, KIN_ILL_INPUT, "KINSOL", "KINInit", MSG_FUNC_NULL);
    return(KIN_ILL_INPUT);
  }

  /* check if all required vector operations are implemented */

  nvectorOK = KINCheckNvector(tmpl);
  if (!nvectorOK) {
    KINProcessError(kin_mem, KIN_ILL_INPUT, "KINSOL", "KINInit", MSG_BAD_NVECTOR);
    return(KIN_ILL_INPUT);
  }

  /* set space requirements for one N_Vector */

  if (tmpl->ops->nvspace != NULL) {
    N_VSpace(tmpl, &lrw1, &liw1);
    kin_mem->kin_lrw1 = lrw1;
    kin_mem->kin_liw1 = liw1;
  }
  else {
    kin_mem->kin_lrw1 = 0;
    kin_mem->kin_liw1 = 0;
  }

  /* allocate necessary vectors */

  allocOK = KINAllocVectors(kin_mem, tmpl);
  if (!allocOK) {
    KINProcessError(kin_mem, KIN_MEM_FAIL, "KINSOL", "KINInit", MSG_MEM_FAIL);
    free(kin_mem); kin_mem = NULL;
    return(KIN_MEM_FAIL);
  }

  /* copy the input parameter into KINSol state */

  kin_mem->kin_func = func;

  /* set the linear solver addresses to NULL */

  kin_mem->kin_linit  = NULL;
  kin_mem->kin_lsetup = NULL;
  kin_mem->kin_lsolve = NULL;
  kin_mem->kin_lfree  = NULL;
  kin_mem->kin_lmem   = NULL;
  
  /* problem memory has been successfully allocated */

  kin_mem->kin_MallocDone = SUNTRUE;

  return(KIN_SUCCESS);
}